

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

aphy_error __thiscall
APhyBullet::BulletWorld::removeRigidBody(BulletWorld *this,collision_object_ref *object)

{
  _func_int **pp_Var1;
  iterator __it;
  aphy_error aVar2;
  
  pp_Var1 = object->counter->object[1].super_base_interface._vptr_base_interface;
  aVar2 = APHY_INVALID_PARAMETER;
  if ((pp_Var1 != (_func_int **)0x0) && (((ulong)pp_Var1[0x20] & 2) != 0)) {
    (*(this->handle->super_btCollisionWorld)._vptr_btCollisionWorld[0x17])();
    __it = std::
           _Hashtable<aphy::ref<aphy::collision_object>,_aphy::ref<aphy::collision_object>,_std::allocator<aphy::ref<aphy::collision_object>_>,_std::__detail::_Identity,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::find(&(this->collisionObjects)._M_h,object);
    aVar2 = APHY_OK;
    if (__it.super__Node_iterator_base<aphy::ref<aphy::collision_object>,_true>._M_cur !=
        (__node_type *)0x0) {
      std::
      _Hashtable<aphy::ref<aphy::collision_object>,_aphy::ref<aphy::collision_object>,_std::allocator<aphy::ref<aphy::collision_object>_>,_std::__detail::_Identity,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::erase(&(this->collisionObjects)._M_h,
              (const_iterator)
              __it.super__Node_iterator_base<aphy::ref<aphy::collision_object>,_true>._M_cur);
    }
  }
  return aVar2;
}

Assistant:

aphy_error BulletWorld::removeRigidBody(const collision_object_ref &object)
{
    auto rigidBody = btRigidBody::upcast(object.as<BulletCollisionObject>()->handle);
    if(!rigidBody)
        return APHY_INVALID_PARAMETER;

    handle->removeRigidBody(rigidBody);

    auto it = collisionObjects.find(object);
    if(it != collisionObjects.end())
        collisionObjects.erase(it);

    return APHY_OK;
}